

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O0

void __thiscall CVmSrcfEntry::alloc_line_records(CVmSrcfEntry *this,ulong cnt)

{
  void *pvVar1;
  ulong in_RSI;
  long in_RDI;
  ulong siz;
  size_t local_18;
  ulong local_10;
  
  if (*(ulong *)(in_RDI + 0x20) < in_RSI) {
    local_18 = in_RSI << 4;
    local_10 = in_RSI;
    if (0xffffffff < local_18) {
      local_10 = 0xfffffff;
      local_18 = 0xfffffff0;
      if (0xffffffe < *(ulong *)(in_RDI + 0x20)) {
        return;
      }
    }
    if (*(long *)(in_RDI + 0x10) == 0) {
      pvVar1 = malloc(local_18);
      *(void **)(in_RDI + 0x10) = pvVar1;
    }
    else {
      pvVar1 = realloc(*(void **)(in_RDI + 0x10),local_18);
      *(void **)(in_RDI + 0x10) = pvVar1;
    }
    *(ulong *)(in_RDI + 0x20) = local_10;
  }
  return;
}

Assistant:

void CVmSrcfEntry::alloc_line_records(ulong cnt)
{
    ulong siz;
    
    /* 
     *   if the current array size is already big enough for the given
     *   count, there's nothing to do 
     */
    if (cnt <= lines_alo_)
        return;

    /* calculate the allocation size */
    siz = cnt * sizeof(lines_[0]);

    /* 
     *   if the new size exceeds the maximum local system's architectural
     *   limit for a single allocation, restrict the size to the maximum
     *   allocation 
     */
    if (siz > OSMALMAX)
    {
        /* recalculate the size for the maximum architectural allocation */
        cnt = OSMALMAX / sizeof(lines_[0]);
        siz = cnt * sizeof(lines_[0]);

        /* if we're already there, ignore the request */
        if (cnt <= lines_alo_)
            return;
    }

    /* allocate or reallocate the line record array */
    if (lines_ == 0)
        lines_ = (CVmSrcfLine *)t3malloc((size_t)siz);
    else
        lines_ = (CVmSrcfLine *)t3realloc(lines_, (size_t)siz);

    /* remember the new array size */
    lines_alo_ = cnt;
}